

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

ExternalRefCountData * QtSharedPointer::ExternalRefCountData::getAndRef(QObject *obj)

{
  QObject ***pppQVar1;
  QObjectData *pQVar2;
  ExternalRefCountData *pEVar3;
  ExternalRefCountData *pEVar4;
  bool bVar5;
  
  pQVar2 = (obj->d_ptr).d;
  pEVar4 = (ExternalRefCountData *)pQVar2[1].children.d.ptr;
  if (pEVar4 == (ExternalRefCountData *)0x0) {
    pEVar3 = (ExternalRefCountData *)operator_new(0x10);
    (pEVar3->strongref)._q_value.super___atomic_base<int>._M_i = -1;
    (pEVar3->weakref)._q_value.super___atomic_base<int>._M_i = 2;
    pppQVar1 = &pQVar2[1].children.d.ptr;
    LOCK();
    pEVar4 = (ExternalRefCountData *)*pppQVar1;
    bVar5 = pEVar4 == (ExternalRefCountData *)0x0;
    if (bVar5) {
      *pppQVar1 = (QObject **)pEVar3;
      pEVar4 = (ExternalRefCountData *)0x0;
    }
    UNLOCK();
    if (bVar5) {
      return pEVar3;
    }
    operator_delete(pEVar3,0x10);
  }
  LOCK();
  (pEVar4->weakref)._q_value.super___atomic_base<int>._M_i =
       (pEVar4->weakref)._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return pEVar4;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }